

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

bool __thiscall
testing::internal::DefaultDeathTestFactory::Create
          (DefaultDeathTestFactory *this,char *statement,RE *regex,char *file,int line,
          DeathTest **test)

{
  int iVar1;
  int iVar2;
  InternalRunDeathTestFlag *__lhs;
  bool bVar3;
  UnitTestImpl *pUVar4;
  ExecDeathTest *this_00;
  string *this_01;
  long in_FS_OFFSET;
  int local_100;
  int death_test_index;
  string local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pUVar4 = GetUnitTestImpl();
  __lhs = (pUVar4->internal_run_death_test_flag_).ptr_;
  iVar2 = (pUVar4->current_test_info_->result_).death_test_count_;
  iVar1 = iVar2 + 1;
  (pUVar4->current_test_info_->result_).death_test_count_ = iVar1;
  death_test_index = iVar1;
  if (__lhs == (InternalRunDeathTestFlag *)0x0) {
LAB_00156f1d:
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            FLAGS_gtest_death_test_style_abi_cxx11_,"threadsafe");
    if (bVar3) {
      this_00 = (ExecDeathTest *)operator_new(0x40);
      ExecDeathTest::ExecDeathTest(this_00,statement,regex,file,line);
    }
    else {
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              FLAGS_gtest_death_test_style_abi_cxx11_,"fast");
      if (!bVar3) {
        std::operator+(&local_78,"Unknown death test style \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       FLAGS_gtest_death_test_style_abi_cxx11_);
        std::operator+(&local_58,&local_78,"\" encountered");
        DeathTest::set_last_death_test_message(&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        this_01 = &local_78;
        goto LAB_001570c5;
      }
      this_00 = (ExecDeathTest *)operator_new(0x30);
      NoExecDeathTest::NoExecDeathTest((NoExecDeathTest *)this_00,statement,regex);
    }
    *test = (DeathTest *)this_00;
  }
  else {
    if (__lhs->index_ <= iVar2) {
      StreamableToString<int>(&local_d8,&death_test_index);
      std::operator+(&local_b8,"Death test count (",&local_d8);
      std::operator+(&local_98,&local_b8,") somehow exceeded expected maximum (");
      local_100 = __lhs->index_;
      StreamableToString<int>(&local_f8,&local_100);
      std::operator+(&local_78,&local_98,&local_f8);
      std::operator+(&local_58,&local_78,")");
      DeathTest::set_last_death_test_message(&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      this_01 = &local_d8;
LAB_001570c5:
      std::__cxx11::string::~string((string *)this_01);
      bVar3 = false;
      goto LAB_001570cc;
    }
    bVar3 = std::operator==(&__lhs->file_,file);
    if (((bVar3) && (__lhs->line_ == line)) && (__lhs->index_ == iVar1)) goto LAB_00156f1d;
    *test = (DeathTest *)0x0;
  }
  bVar3 = true;
LAB_001570cc:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool DefaultDeathTestFactory::Create(const char* statement, const RE* regex,
                                     const char* file, int line,
                                     DeathTest** test) {
  UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const int death_test_index = impl->current_test_info()
      ->increment_death_test_count();

  if (flag != NULL) {
    if (death_test_index > flag->index()) {
      DeathTest::set_last_death_test_message(
          "Death test count (" + StreamableToString(death_test_index)
          + ") somehow exceeded expected maximum ("
          + StreamableToString(flag->index()) + ")");
      return false;
    }

    if (!(flag->file() == file && flag->line() == line &&
          flag->index() == death_test_index)) {
      *test = NULL;
      return true;
    }
  }

# if GTEST_OS_WINDOWS

  if (GTEST_FLAG(death_test_style) == "threadsafe" ||
      GTEST_FLAG(death_test_style) == "fast") {
    *test = new WindowsDeathTest(statement, regex, file, line);
  }

# elif GTEST_OS_FUCHSIA

  if (GTEST_FLAG(death_test_style) == "threadsafe" ||
      GTEST_FLAG(death_test_style) == "fast") {
    *test = new FuchsiaDeathTest(statement, regex, file, line);
  }

# else

  if (GTEST_FLAG(death_test_style) == "threadsafe") {
    *test = new ExecDeathTest(statement, regex, file, line);
  } else if (GTEST_FLAG(death_test_style) == "fast") {
    *test = new NoExecDeathTest(statement, regex);
  }

# endif  // GTEST_OS_WINDOWS

  else {  // NOLINT - this is more readable than unbalanced brackets inside #if.
    DeathTest::set_last_death_test_message(
        "Unknown death test style \"" + GTEST_FLAG(death_test_style)
        + "\" encountered");
    return false;
  }